

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdnode.cc
# Opt level: O0

void __thiscall bdNode::pingRelayServers(bdNode *this)

{
  bdQueryManager *this_00;
  bool bVar1;
  reference id;
  iterator iStack_58;
  uint32_t qflags;
  _List_node_base *local_50;
  _List_iterator<bdNodeId> local_38;
  iterator it;
  list<bdNodeId,_std::allocator<bdNodeId>_> peerList;
  uint32_t flags;
  bool doSearch;
  bdNode *this_local;
  
  std::__cxx11::list<bdNodeId,_std::allocator<bdNodeId>_>::list
            ((list<bdNodeId,_std::allocator<bdNodeId>_> *)&it);
  std::_List_iterator<bdNodeId>::_List_iterator(&local_38);
  bdFriendList::findPeersWithFlags
            (&this->mFriendList,0x80000,(list<bdNodeId,_std::allocator<bdNodeId>_> *)&it);
  local_50 = (_List_node_base *)
             std::__cxx11::list<bdNodeId,_std::allocator<bdNodeId>_>::begin
                       ((list<bdNodeId,_std::allocator<bdNodeId>_> *)&it);
  local_38._M_node = local_50;
  while( true ) {
    iStack_58 = std::__cxx11::list<bdNodeId,_std::allocator<bdNodeId>_>::end
                          ((list<bdNodeId,_std::allocator<bdNodeId>_> *)&it);
    bVar1 = std::operator!=(&local_38,&stack0xffffffffffffffa8);
    if (!bVar1) break;
    this_00 = this->mQueryMgr;
    id = std::_List_iterator<bdNodeId>::operator*(&local_38);
    bdQueryManager::addQuery(this_00,id,5);
    std::_List_iterator<bdNodeId>::operator++(&local_38,0);
  }
  std::__cxx11::list<bdNodeId,_std::allocator<bdNodeId>_>::~list
            ((list<bdNodeId,_std::allocator<bdNodeId>_> *)&it);
  return;
}

Assistant:

void bdNode::pingRelayServers() {
	/* if Relay's have been switched on, do search/ping to locate servers */
#ifdef DEBUG_NODE_MSGS
	std::cerr << "bdNode::pingRelayServers()";
	std::cerr << std::endl;
#endif

	bool doSearch = true;

	uint32_t flags = BITDHT_PEER_STATUS_DHT_RELAY_SERVER;
	std::list<bdNodeId> peerList;
	std::list<bdNodeId>::iterator it;

	mFriendList.findPeersWithFlags(flags, peerList);
	for (it = peerList.begin(); it != peerList.end(); it++) {
		if (doSearch) {
			uint32_t qflags = BITDHT_QFLAGS_INTERNAL | BITDHT_QFLAGS_DISGUISE;
			mQueryMgr->addQuery(&(*it), qflags);

#ifdef DEBUG_NODE_MSGS
			std::cerr << "bdNode::pingRelayServers() Adding Internal Search for Relay Server: ";
			mFns->bdPrintNodeId(std::cerr, &(*it));
			std::cerr << std::endl;
#endif

		}
        /* try ping - if we have an address??? */
	}
}